

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

void __thiscall smf::MidiFile::joinTracks(MidiFile *this)

{
  int iVar1;
  int iVar2;
  MidiEventList *pMVar3;
  MidiEvent *event;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  MidiEventList *joinedTrack;
  
  if (this->m_theTrackState != 1) {
    if (((long)(this->m_events).
               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->m_events).
               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
               _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 8) {
      pMVar3 = (MidiEventList *)operator_new(0x18);
      MidiEventList::MidiEventList(pMVar3);
      uVar6 = (ulong)((long)(this->m_events).
                            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_events).
                           super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3;
      uVar4 = 0;
      uVar7 = uVar6 & 0xffffffff;
      if ((int)uVar6 < 1) {
        uVar7 = uVar4;
      }
      iVar5 = 0;
      joinedTrack = pMVar3;
      for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        iVar1 = MidiEventList::size((this->m_events).
                                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar4]);
        iVar5 = iVar5 + iVar1;
      }
      MidiEventList::reserve(pMVar3,(int)((double)iVar5 * 0.1 + (double)(iVar5 + 0x20)));
      iVar5 = this->m_theTimeState;
      if (iVar5 == 0) {
        makeAbsoluteTicks(this);
      }
      for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
        iVar1 = 0;
        while( true ) {
          iVar2 = MidiEventList::size((this->m_events).
                                      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar4]);
          if (iVar2 <= iVar1) break;
          event = MidiEventList::operator[]
                            ((this->m_events).
                             super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4],iVar1);
          MidiEventList::push_back_no_copy(pMVar3,event);
          iVar1 = iVar1 + 1;
        }
      }
      clear_no_deallocate(this);
      pMVar3 = *(this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pMVar3 != (MidiEventList *)0x0) {
        MidiEventList::~MidiEventList(pMVar3);
      }
      operator_delete(pMVar3);
      std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
                (&this->m_events,0);
      std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::push_back
                (&this->m_events,&joinedTrack);
      sortTracks(this);
      if (iVar5 == 0) {
        makeDeltaTicks(this);
      }
    }
    this->m_theTrackState = 1;
  }
  return;
}

Assistant:

void MidiFile::joinTracks(void) {
	if (getTrackState() == TRACK_STATE_JOINED) {
		return;
	}
	if (getNumTracks() == 1) {
		m_theTrackState = TRACK_STATE_JOINED;
		return;
	}

	MidiEventList* joinedTrack;
	joinedTrack = new MidiEventList;

	int messagesum = 0;
	int length = getNumTracks();
	int i, j;
	for (i=0; i<length; i++) {
		messagesum += (*m_events[i]).size();
	}
	joinedTrack->reserve((int)(messagesum + 32 + messagesum * 0.1));

	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeAbsoluteTicks();
	}
	for (i=0; i<length; i++) {
		for (j=0; j<(int)m_events[i]->size(); j++) {
			joinedTrack->push_back_no_copy(&(*m_events[i])[j]);
		}
	}

	clear_no_deallocate();

	delete m_events[0];
	m_events.resize(0);
	m_events.push_back(joinedTrack);
	sortTracks();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeDeltaTicks();
	}

	m_theTrackState = TRACK_STATE_JOINED;
}